

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

int64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getSmallIntUnchecked(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  int64_t iVar2;
  
  do {
    bVar1 = **(byte **)this;
    if ((byte)(bVar1 - 0x30) < 10) {
      return (ulong)(bVar1 & 0xf);
    }
    if ((byte)(bVar1 - 0x3a) < 6) {
      return (long)(char)bVar1 | 0xffffffffffffffc0;
    }
    if (((int)(char)bVar1 & 0xf0U | 8) != 0x28) {
      return 0;
    }
  } while ((**(byte **)this & 0xf8) != 0x20);
  iVar2 = (*(code *)(&DAT_001130ec + *(int *)(&DAT_001130ec + (ulong)(**(byte **)this - 0x20) * 4)))
                    (this,&DAT_001130ec,
                     &DAT_001130ec + *(int *)(&DAT_001130ec + (ulong)(**(byte **)this - 0x20) * 4));
  return iVar2;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }